

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

void __thiscall Potassco::ProgramOptions::SyntaxError::~SyntaxError(SyntaxError *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SyntaxError_0015c950;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  Error::~Error((Error *)0x130bb4);
  return;
}

Assistant:

~SyntaxError() throw () {}